

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O3

void normalizationCorrectionsLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  char *s;
  undefined8 uVar1;
  FILE *__stream;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  UErrorCode *pErrorCode_00;
  UStringPrepType type;
  int iVar7;
  UErrorCode *pUVar8;
  UErrorCode code;
  char **__endptr;
  ulong unaff_R14;
  UVersionInfo version;
  UVersionInfo thisVersion;
  char *end;
  uint32_t mapping [40];
  uint32_t uStack_1c8;
  uint32_t uStack_1c4;
  ulong uStack_1c0;
  char *pcStack_1b8;
  uint32_t auStack_1b0 [42];
  UErrorCode *pUStack_108;
  byte local_d8;
  byte local_d7;
  byte local_d4;
  byte local_d3;
  char *local_d0;
  uint32_t local_c8 [42];
  
  pErrorCode_00 = pErrorCode;
  uVar4 = strtoul((*fields)[0],&local_d0,0x10);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pErrorCode_00 = pErrorCode;
    iVar2 = u_parseCodePoints(fields[1][0],local_c8,0x28,pErrorCode);
    u_versionFromString_63(&local_d8,fields[3][0]);
    u_versionFromString_63(&local_d4,"3.2.0");
    pUVar8 = (UErrorCode *)(ulong)(uint)*pErrorCode;
    unaff_R14 = uVar4;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_d4 < local_d8) || ((local_d8 == local_d4 && (local_d3 < local_d7)))) {
        storeMapping((uint32_t)uVar4,local_c8,iVar2,USPREP_MAP,pErrorCode);
      }
      setUnicodeVersionNC(&local_d8);
      return;
    }
  }
  else {
    pUVar8 = pErrorCode;
    normalizationCorrectionsLineFn_cold_2();
  }
  normalizationCorrectionsLineFn_cold_1();
  uStack_1c4 = 0;
  uStack_1c8 = 0;
  pUStack_108 = pErrorCode;
  pcVar5 = u_skipWhitespace(*(char **)pUVar8);
  if (*pcVar5 == '@') {
    pcVar5 = pcVar5 + 1;
    iVar7 = pUVar8[2] - (int)pcVar5;
    if (8 < iVar7) {
      iVar3 = strncmp(pcVar5,"normalize",9);
      if (iVar3 == 0) {
        options[8].doesOccur = '\x01';
        return;
      }
      if ((iVar7 != 9) && (iVar7 = strncmp(pcVar5,"check-bidi",10), iVar7 == 0)) {
        options[10].doesOccur = '\x01';
        return;
      }
    }
    strprepProfileLineFn_cold_1();
  }
  s = *(char **)(pUVar8 + 4);
  __endptr = *(char ***)(pUVar8 + 8);
  pcVar6 = strstr((char *)__endptr,"UNASSIGNED");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = strstr((char *)__endptr,"PROHIBITED");
    if (pcVar6 != (char *)0x0) {
      u_parseCodePointRange(pcVar5,&uStack_1c4,&uStack_1c8,pErrorCode_00);
      if (U_ZERO_ERROR < *pErrorCode_00) {
        strprepProfileLineFn_cold_3();
        return;
      }
      type = USPREP_PROHIBITED;
      goto LAB_00109fa3;
    }
    pcVar6 = strstr((char *)__endptr,"MAP");
    if (pcVar6 == (char *)0x0) {
LAB_0010a09d:
      *pErrorCode_00 = U_INVALID_FORMAT_ERROR;
      code = U_INVALID_FORMAT_ERROR;
      goto LAB_0010a05c;
    }
    __endptr = &pcStack_1b8;
    uStack_1c0 = strtoul(pcVar5,__endptr,0x10);
    if ((pcStack_1b8 <= pcVar5) || (pcStack_1b8 != *(char **)(pUVar8 + 2))) {
      strprepProfileLineFn_cold_4();
      goto LAB_0010a09d;
    }
    iVar2 = u_parseCodePoints(s,auStack_1b0,0x28,pErrorCode_00);
    storeMapping((uint32_t)uStack_1c0,auStack_1b0,iVar2,USPREP_MAP,pErrorCode_00);
  }
  else {
    u_parseCodePointRange(pcVar5,&uStack_1c4,&uStack_1c8,pErrorCode_00);
    if (U_ZERO_ERROR < *pErrorCode_00) {
      strprepProfileLineFn_cold_2();
      return;
    }
    type = USPREP_UNASSIGNED;
LAB_00109fa3:
    storeRange(uStack_1c4,uStack_1c8,type,pErrorCode_00);
  }
  code = *pErrorCode_00;
  if (code < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  __endptr = *(char ***)(pUVar8 + 8);
LAB_0010a05c:
  __stream = _stderr;
  uVar1 = *(undefined8 *)pUVar8;
  pcVar5 = u_errorName_63(code);
  fprintf(__stream,"gensprep error parsing  %s line %s at %s. Error: %s\n",unaff_R14,uVar1,__endptr,
          pcVar5);
  exit(*pErrorCode_00);
}

Assistant:

static void U_CALLCONV
normalizationCorrectionsLineFn(void *context,
                    char *fields[][2], int32_t fieldCount,
                    UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *s;
    uint32_t code;
    int32_t length;
    UVersionInfo version;
    UVersionInfo thisVersion;

    /* get the character code, field 0 */
    code=(uint32_t)uprv_strtoul(fields[0][0], &end, 16);
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep: error parsing NormalizationCorrections.txt mapping at %s\n", fields[0][0]);
        exit(*pErrorCode);
    }
    /* Original (erroneous) decomposition */
    s = fields[1][0];

    /* parse the mapping string */
    length=u_parseCodePoints(s, mapping, sizeof(mapping)/4, pErrorCode);

    /* ignore corrected decomposition */

    u_versionFromString(version,fields[3][0] );
    u_versionFromString(thisVersion, "3.2.0");



    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing NormalizationCorrections.txt of U+%04lx - %s\n",
                (long)code, u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

    /* store the mapping */
    if( version[0] > thisVersion[0] || 
        ((version[0]==thisVersion[0]) && (version[1] > thisVersion[1]))
        ){
        storeMapping(code,mapping, length, USPREP_MAP, pErrorCode);
    }
    setUnicodeVersionNC(version);
}